

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glib_compat.c
# Opt level: O0

void g_hash_table_insert_internal
               (GHashTable *hash_table,gpointer key,gpointer value,gboolean keep_new_key)

{
  uint uVar1;
  guint local_38;
  guint old_hash;
  guint key_hash;
  guint node_index;
  GHashNode *node;
  gpointer pvStack_20;
  gboolean keep_new_key_local;
  gpointer value_local;
  gpointer key_local;
  GHashTable *hash_table_local;
  
  if ((hash_table != (GHashTable *)0x0) && (hash_table->ref_count != 0)) {
    node._4_4_ = keep_new_key;
    pvStack_20 = value;
    value_local = key;
    key_local = hash_table;
    old_hash = g_hash_table_lookup_node_for_insertion(hash_table,key,&local_38);
    _key_hash = (undefined8 *)(*(long *)((long)key_local + 0x18) + (ulong)old_hash * 0x18);
    uVar1 = *(uint *)(_key_hash + 2);
    if (uVar1 < 2) {
      *_key_hash = value_local;
      _key_hash[1] = pvStack_20;
      *(guint *)(_key_hash + 2) = local_38;
      *(int *)((long)key_local + 0xc) = *(int *)((long)key_local + 0xc) + 1;
      if (uVar1 == 0) {
        *(int *)((long)key_local + 0x10) = *(int *)((long)key_local + 0x10) + 1;
        g_hash_table_maybe_resize((GHashTable *)key_local);
      }
    }
    else {
      if (node._4_4_ == 0) {
        if (*(long *)((long)key_local + 0x38) != 0) {
          (**(code **)((long)key_local + 0x38))(value_local);
        }
      }
      else {
        if (*(long *)((long)key_local + 0x38) != 0) {
          (**(code **)((long)key_local + 0x38))(*_key_hash);
        }
        *_key_hash = value_local;
      }
      if (*(long *)((long)key_local + 0x40) != 0) {
        (**(code **)((long)key_local + 0x40))(_key_hash[1]);
      }
      _key_hash[1] = pvStack_20;
    }
  }
  return;
}

Assistant:

static void g_hash_table_insert_internal (GHashTable *hash_table,
        gpointer    key,
        gpointer    value,
        gboolean    keep_new_key)
{
    GHashNode *node;
    guint node_index;
    guint key_hash;
    guint old_hash;

    if (hash_table == NULL) return;
    if (hash_table->ref_count == 0) return;

    node_index = g_hash_table_lookup_node_for_insertion (hash_table, key, &key_hash);
    node = &hash_table->nodes [node_index];

    old_hash = node->key_hash;

    if (old_hash > 1)
    {
        if (keep_new_key)
        {
            if (hash_table->key_destroy_func)
                hash_table->key_destroy_func (node->key);
            node->key = key;
        }
        else
        {
            if (hash_table->key_destroy_func)
                hash_table->key_destroy_func (key);
        }

        if (hash_table->value_destroy_func)
            hash_table->value_destroy_func (node->value);

        node->value = value;
    }
    else
    {
        node->key = key;
        node->value = value;
        node->key_hash = key_hash;

        hash_table->nnodes++;

        if (old_hash == 0)
        {
            /* We replaced an empty node, and not a tombstone */
            hash_table->noccupied++;
            g_hash_table_maybe_resize (hash_table);
        }
    }
}